

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::QHostAddress(QHostAddress *this,sockaddr *sockaddr)

{
  short *in_RSI;
  QHostAddressPrivate *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  quint32 in_stack_ffffffffffffffdc;
  
  operator_new(0x38);
  QHostAddressPrivate::QHostAddressPrivate(in_RDI);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)in_RDI,
             (QHostAddressPrivate *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (*in_RSI == 2) {
    htonl(*(uint32_t *)(in_RSI + 2));
    setAddress((QHostAddress *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else if (*in_RSI == 10) {
    setAddress((QHostAddress *)in_RDI,
               (quint8 *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

QHostAddress::QHostAddress(const struct sockaddr *sockaddr)
    : d(new QHostAddressPrivate)
{
    if (sockaddr->sa_family == AF_INET)
        setAddress(htonl(((const sockaddr_in *)sockaddr)->sin_addr.s_addr));
    else if (sockaddr->sa_family == AF_INET6)
        setAddress(((const sockaddr_in6 *)sockaddr)->sin6_addr.s6_addr);
}